

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Cast_x86_avx512::forward(Cast_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 (*pauVar1) [32];
  int _d;
  int _elempack;
  _func_int *p_Var2;
  int *piVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  byte bVar12;
  byte bVar13;
  unsigned_short uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  void *pvVar18;
  uint uVar19;
  uint uVar20;
  size_t sVar21;
  void *pvVar22;
  long lVar23;
  ulong uVar24;
  undefined1 (*pauVar25) [64];
  undefined1 (*pauVar26) [16];
  ulong uVar27;
  undefined1 (*pauVar28) [32];
  undefined1 (*pauVar29) [16];
  int iVar30;
  uint uVar31;
  uint uVar32;
  long lVar33;
  ushort uVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  float fVar43;
  
  p_Var2 = this->_vptr_Cast_x86_avx512[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var2) == *(int *)(&this->field_0xd4 + (long)p_Var2)) {
    iVar15 = 0;
    if (top_blob != bottom_blob) {
      piVar3 = bottom_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 0x18))();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar3 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar3;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar15 = bottom_blob->w;
      iVar17 = bottom_blob->h;
      iVar30 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar15;
      top_blob->h = iVar17;
      top_blob->d = iVar30;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      iVar15 = 0;
    }
  }
  else {
    iVar17 = bottom_blob->w;
    iVar30 = bottom_blob->h;
    _d = bottom_blob->d;
    uVar20 = bottom_blob->c;
    iVar15 = bottom_blob->dims;
    _elempack = bottom_blob->elempack;
    sVar21 = (size_t)_elempack;
    switch(*(int *)(&this->field_0xd4 + (long)p_Var2)) {
    case 1:
      if (*(int *)(&this->field_0xd0 + (long)p_Var2) == 3) {
        Cast::forward((Cast *)((long)&this->_vptr_Cast_x86_avx512 + (long)p_Var2),bottom_blob,
                      top_blob,opt);
      }
      sVar21 = sVar21 * 4;
      break;
    case 2:
    case 4:
      sVar21 = (size_t)(_elempack * 2);
      break;
    case 3:
      break;
    default:
      sVar21 = bottom_blob->elemsize;
    }
    switch(iVar15) {
    case 1:
      Mat::create(top_blob,iVar17,sVar21,_elempack,opt->blob_allocator);
      break;
    case 2:
      Mat::create(top_blob,iVar17,iVar30,sVar21,_elempack,opt->blob_allocator);
      break;
    case 3:
      Mat::create(top_blob,iVar17,iVar30,uVar20,sVar21,_elempack,opt->blob_allocator);
      break;
    case 4:
      Mat::create(top_blob,iVar17,iVar30,_d,uVar20,sVar21,_elempack,opt->blob_allocator);
    }
    iVar15 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx512[-3]) == 1) &&
         (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx512[-3]) == 2)) {
        iVar15 = cpu_support_x86_avx512_fp16();
        if (iVar15 == 0) {
          iVar15 = bottom_blob->c;
          if (0 < (long)iVar15) {
            uVar31 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
            lVar23 = 0;
            do {
              pauVar28 = (undefined1 (*) [32])
                         (bottom_blob->cstep * lVar23 * bottom_blob->elemsize +
                         (long)bottom_blob->data);
              pauVar26 = (undefined1 (*) [16])
                         (top_blob->cstep * lVar23 * top_blob->elemsize + (long)top_blob->data);
              if ((int)uVar31 < 8) {
                uVar32 = 0;
              }
              else {
                iVar16 = 7;
                do {
                  auVar8 = vcvtps2ph_f16c(*pauVar28,3);
                  *pauVar26 = auVar8;
                  pauVar28 = pauVar28 + 1;
                  pauVar26 = pauVar26 + 1;
                  iVar16 = iVar16 + 8;
                  uVar32 = uVar31 & 0xfffffff8;
                } while (iVar16 < (int)uVar31);
              }
              uVar19 = uVar32 | 3;
              while ((int)uVar19 < (int)uVar31) {
                vcvtps2ph_f16c(*(undefined1 (*) [16])*pauVar28,3);
                pauVar28 = (undefined1 (*) [32])(*pauVar28 + 0x10);
                pauVar26 = (undefined1 (*) [16])(*pauVar26 + 8);
                uVar19 = uVar32 + 7;
                uVar32 = uVar32 + 4;
              }
              if (uVar31 - uVar32 != 0 && (int)uVar32 <= (int)uVar31) {
                lVar33 = 0;
                do {
                  uVar14 = float32_to_float16(*(float *)(*pauVar28 + lVar33 * 4));
                  *(unsigned_short *)(*pauVar26 + lVar33 * 2) = uVar14;
                  lVar33 = lVar33 + 1;
                } while (uVar31 - uVar32 != (int)lVar33);
              }
              lVar23 = lVar23 + 1;
            } while (lVar23 != iVar15);
          }
        }
        else {
          cast_fp32_to_fp16_sse_avx512fp16(bottom_blob,top_blob,opt);
        }
      }
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx512[-3]) == 2) &&
         (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx512[-3]) == 1)) {
        iVar15 = cpu_support_x86_avx512_fp16();
        if (iVar15 == 0) {
          iVar15 = bottom_blob->c;
          if (0 < (long)iVar15) {
            uVar31 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
            lVar23 = 0;
            do {
              pauVar26 = (undefined1 (*) [16])
                         (bottom_blob->cstep * lVar23 * bottom_blob->elemsize +
                         (long)bottom_blob->data);
              pauVar28 = (undefined1 (*) [32])
                         (top_blob->cstep * lVar23 * top_blob->elemsize + (long)top_blob->data);
              if ((int)uVar31 < 8) {
                uVar32 = 0;
              }
              else {
                iVar16 = 7;
                do {
                  auVar37 = vcvtph2ps_f16c(*pauVar26);
                  *pauVar28 = auVar37;
                  pauVar26 = pauVar26 + 1;
                  pauVar28 = pauVar28 + 1;
                  iVar16 = iVar16 + 8;
                  uVar32 = uVar31 & 0xfffffff8;
                } while (iVar16 < (int)uVar31);
              }
              uVar19 = uVar32 | 3;
              while ((int)uVar19 < (int)uVar31) {
                auVar8._8_8_ = 0;
                auVar8._0_8_ = *(ulong *)*pauVar26;
                auVar8 = vcvtph2ps_f16c(auVar8);
                *(undefined1 (*) [16])*pauVar28 = auVar8;
                pauVar26 = (undefined1 (*) [16])(*pauVar26 + 8);
                pauVar28 = (undefined1 (*) [32])(*pauVar28 + 0x10);
                uVar19 = uVar32 + 7;
                uVar32 = uVar32 + 4;
              }
              if (uVar31 - uVar32 != 0 && (int)uVar32 <= (int)uVar31) {
                lVar33 = 0;
                do {
                  fVar43 = float16_to_float32(*(unsigned_short *)(*pauVar26 + lVar33 * 2));
                  *(float *)(*pauVar28 + lVar33 * 4) = fVar43;
                  lVar33 = lVar33 + 1;
                } while (uVar31 - uVar32 != (int)lVar33);
              }
              lVar23 = lVar23 + 1;
            } while (lVar23 != iVar15);
          }
        }
        else {
          cast_fp16_to_fp32_sse_avx512fp16(bottom_blob,top_blob,opt);
        }
      }
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx512[-3]) == 3) &&
         (0 < (int)uVar20 &&
          *(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx512[-3]) == 1)) {
        uVar31 = _d * _elempack * iVar30 * iVar17;
        pvVar18 = bottom_blob->data;
        sVar21 = bottom_blob->cstep;
        pvVar22 = top_blob->data;
        sVar4 = top_blob->cstep;
        sVar5 = top_blob->elemsize;
        sVar6 = bottom_blob->elemsize;
        uVar24 = 0;
        do {
          if (0 < (int)uVar31) {
            uVar27 = 0;
            do {
              *(float *)((long)pvVar22 + uVar27 * 4) = (float)(int)*(char *)((long)pvVar18 + uVar27)
              ;
              uVar27 = uVar27 + 1;
            } while (uVar31 != uVar27);
          }
          uVar24 = uVar24 + 1;
          pvVar22 = (void *)((long)pvVar22 + sVar4 * sVar5);
          pvVar18 = (void *)((long)pvVar18 + sVar21 * sVar6);
        } while (uVar24 != uVar20);
      }
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx512[-3]) == 1) &&
         (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx512[-3]) == 4)) {
        iVar15 = cpu_support_x86_avx512_bf16();
        if (iVar15 == 0) {
          iVar15 = bottom_blob->c;
          if (0 < (long)iVar15) {
            uVar20 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
            lVar23 = 0;
            auVar37._16_16_ = _DAT_0054ebc0;
            auVar37._0_16_ = _DAT_0054ebc0;
            auVar38 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar39 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            do {
              pauVar25 = (undefined1 (*) [64])
                         (bottom_blob->cstep * lVar23 * bottom_blob->elemsize +
                         (long)bottom_blob->data);
              pauVar28 = (undefined1 (*) [32])
                         (top_blob->cstep * lVar23 * top_blob->elemsize + (long)top_blob->data);
              if ((int)uVar20 < 0x10) {
                uVar31 = 0;
              }
              else {
                iVar17 = 0xf;
                do {
                  auVar40 = vpsrld_avx512f(*pauVar25,0x10);
                  auVar35 = vpmovdw_avx512f(auVar40);
                  *pauVar28 = auVar35;
                  pauVar25 = pauVar25 + 1;
                  pauVar28 = pauVar28 + 1;
                  iVar17 = iVar17 + 0x10;
                  uVar31 = uVar20 & 0xfffffff0;
                } while (iVar17 < (int)uVar20);
              }
              uVar32 = uVar31 | 7;
              while ((int)uVar32 < (int)uVar20) {
                auVar35 = vpermw_avx512vl(auVar37,*(undefined1 (*) [32])*pauVar25);
                *(undefined1 (*) [16])*pauVar28 = auVar35._0_16_;
                pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x20);
                pauVar28 = (undefined1 (*) [32])((long)*pauVar28 + 0x10);
                uVar32 = uVar31 + 0xf;
                uVar31 = uVar31 + 8;
              }
              if ((int)uVar31 < (int)uVar20) {
                auVar40 = vpbroadcastq_avx512f();
                uVar24 = 0;
                do {
                  auVar41 = vpbroadcastq_avx512f();
                  auVar42 = vporq_avx512f(auVar41,auVar38);
                  auVar41 = vporq_avx512f(auVar41,auVar39);
                  uVar10 = vpcmpuq_avx512f(auVar41,auVar40,2);
                  bVar12 = (byte)uVar10;
                  uVar10 = vpcmpuq_avx512f(auVar42,auVar40,2);
                  bVar13 = (byte)uVar10;
                  uVar34 = CONCAT11(bVar13,bVar12);
                  auVar42 = vmovdqu32_avx512f(*(undefined1 (*) [64])(*pauVar25 + uVar24 * 4));
                  auVar41._4_4_ = (uint)((byte)(uVar34 >> 1) & 1) * auVar42._4_4_;
                  auVar41._0_4_ = (uint)(bVar12 & 1) * auVar42._0_4_;
                  auVar41._8_4_ = (uint)((byte)(uVar34 >> 2) & 1) * auVar42._8_4_;
                  auVar41._12_4_ = (uint)((byte)(uVar34 >> 3) & 1) * auVar42._12_4_;
                  auVar41._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * auVar42._16_4_;
                  auVar41._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * auVar42._20_4_;
                  auVar41._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * auVar42._24_4_;
                  auVar41._28_4_ = (uint)((byte)(uVar34 >> 7) & 1) * auVar42._28_4_;
                  auVar41._32_4_ = (uint)(bVar13 & 1) * auVar42._32_4_;
                  auVar41._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar42._36_4_;
                  auVar41._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar42._40_4_;
                  auVar41._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar42._44_4_;
                  auVar41._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar42._48_4_;
                  auVar41._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar42._52_4_;
                  auVar41._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar42._56_4_;
                  auVar41._60_4_ = (uint)(bVar13 >> 7) * auVar42._60_4_;
                  auVar41 = vpsrld_avx512f(auVar41,0x10);
                  pauVar1 = (undefined1 (*) [32])((long)*pauVar28 + uVar24 * 2);
                  auVar35 = vpmovdw_avx512f(auVar41);
                  auVar36._0_2_ =
                       (ushort)(bVar12 & 1) * auVar35._0_2_ |
                       (ushort)!(bool)(bVar12 & 1) * *(short *)*pauVar1;
                  bVar7 = (bool)((byte)(uVar34 >> 1) & 1);
                  auVar36._2_2_ =
                       (ushort)bVar7 * auVar35._2_2_ |
                       (ushort)!bVar7 * *(short *)((long)*pauVar1 + 2);
                  bVar7 = (bool)((byte)(uVar34 >> 2) & 1);
                  auVar36._4_2_ =
                       (ushort)bVar7 * auVar35._4_2_ |
                       (ushort)!bVar7 * *(short *)((long)*pauVar1 + 4);
                  bVar7 = (bool)((byte)(uVar34 >> 3) & 1);
                  auVar36._6_2_ =
                       (ushort)bVar7 * auVar35._6_2_ |
                       (ushort)!bVar7 * *(short *)((long)*pauVar1 + 6);
                  bVar7 = (bool)((byte)(uVar34 >> 4) & 1);
                  auVar36._8_2_ =
                       (ushort)bVar7 * auVar35._8_2_ |
                       (ushort)!bVar7 * *(short *)((long)*pauVar1 + 8);
                  bVar7 = (bool)((byte)(uVar34 >> 5) & 1);
                  auVar36._10_2_ =
                       (ushort)bVar7 * auVar35._10_2_ |
                       (ushort)!bVar7 * *(short *)((long)*pauVar1 + 10);
                  bVar7 = (bool)((byte)(uVar34 >> 6) & 1);
                  auVar36._12_2_ =
                       (ushort)bVar7 * auVar35._12_2_ |
                       (ushort)!bVar7 * *(short *)((long)*pauVar1 + 0xc);
                  bVar7 = (bool)((byte)(uVar34 >> 7) & 1);
                  auVar36._14_2_ =
                       (ushort)bVar7 * auVar35._14_2_ |
                       (ushort)!bVar7 * *(short *)((long)*pauVar1 + 0xe);
                  auVar36._16_2_ =
                       (ushort)(bVar13 & 1) * auVar35._16_2_ |
                       (ushort)!(bool)(bVar13 & 1) * *(short *)((long)*pauVar1 + 0x10);
                  bVar7 = (bool)(bVar13 >> 1 & 1);
                  auVar36._18_2_ =
                       (ushort)bVar7 * auVar35._18_2_ |
                       (ushort)!bVar7 * *(short *)((long)*pauVar1 + 0x12);
                  bVar7 = (bool)(bVar13 >> 2 & 1);
                  auVar36._20_2_ =
                       (ushort)bVar7 * auVar35._20_2_ |
                       (ushort)!bVar7 * *(short *)((long)*pauVar1 + 0x14);
                  bVar7 = (bool)(bVar13 >> 3 & 1);
                  auVar36._22_2_ =
                       (ushort)bVar7 * auVar35._22_2_ |
                       (ushort)!bVar7 * *(short *)((long)*pauVar1 + 0x16);
                  bVar7 = (bool)(bVar13 >> 4 & 1);
                  auVar36._24_2_ =
                       (ushort)bVar7 * auVar35._24_2_ |
                       (ushort)!bVar7 * *(short *)((long)*pauVar1 + 0x18);
                  bVar7 = (bool)(bVar13 >> 5 & 1);
                  auVar36._26_2_ =
                       (ushort)bVar7 * auVar35._26_2_ |
                       (ushort)!bVar7 * *(short *)((long)*pauVar1 + 0x1a);
                  bVar7 = (bool)(bVar13 >> 6 & 1);
                  auVar36._28_2_ =
                       (ushort)bVar7 * auVar35._28_2_ |
                       (ushort)!bVar7 * *(short *)((long)*pauVar1 + 0x1c);
                  auVar36._30_2_ =
                       (ushort)(bVar13 >> 7) * auVar35._30_2_ |
                       (ushort)!(bool)(bVar13 >> 7) * *(short *)((long)*pauVar1 + 0x1e);
                  *pauVar1 = auVar36;
                  uVar24 = uVar24 + 0x10;
                } while (((ulong)(~uVar31 + uVar20) + 0x10 & 0x1fffffff0) != uVar24);
              }
              lVar23 = lVar23 + 1;
            } while (lVar23 != iVar15);
          }
        }
        else {
          cast_fp32_to_bf16_sse_avx512bf16(bottom_blob,top_blob,opt);
        }
      }
      iVar15 = 0;
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx512[-3]) == 4) &&
         (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx512[-3]) == 1)) {
        iVar17 = cpu_support_x86_avx512_bf16();
        if (iVar17 == 0) {
          iVar17 = bottom_blob->c;
          if (0 < (long)iVar17) {
            uVar20 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
            lVar23 = 0;
            auVar38 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar39 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            iVar15 = 0;
            do {
              pauVar26 = (undefined1 (*) [16])
                         (bottom_blob->cstep * lVar23 * bottom_blob->elemsize +
                         (long)bottom_blob->data);
              pauVar29 = (undefined1 (*) [16])
                         (top_blob->cstep * lVar23 * top_blob->elemsize + (long)top_blob->data);
              if ((int)uVar20 < 8) {
                uVar31 = 0;
              }
              else {
                iVar30 = 7;
                do {
                  auVar8 = vlddqu_avx(*pauVar26);
                  auVar9 = vpunpcklwd_avx(ZEXT816(0) << 0x40,auVar8);
                  auVar8 = vpunpckhwd_avx(ZEXT816(0) << 0x40,auVar8);
                  pauVar29[1] = auVar8;
                  *pauVar29 = auVar9;
                  pauVar26 = pauVar26 + 1;
                  pauVar29 = pauVar29 + 2;
                  iVar30 = iVar30 + 8;
                  uVar31 = uVar20 & 0xfffffff8;
                } while (iVar30 < (int)uVar20);
              }
              if ((int)uVar31 < (int)uVar20) {
                auVar40 = vpbroadcastq_avx512f();
                uVar24 = 0;
                do {
                  auVar41 = vpbroadcastq_avx512f();
                  auVar42 = vporq_avx512f(auVar41,auVar38);
                  auVar41 = vporq_avx512f(auVar41,auVar39);
                  uVar10 = vpcmpuq_avx512f(auVar41,auVar40,2);
                  uVar11 = vpcmpuq_avx512f(auVar42,auVar40,2);
                  bVar12 = (byte)uVar11;
                  uVar34 = CONCAT11(bVar12,(byte)uVar10);
                  auVar37 = vmovdqu16_avx512vl(*(undefined1 (*) [32])(*pauVar26 + uVar24 * 2));
                  auVar35._2_2_ = (ushort)((byte)(uVar34 >> 1) & 1) * auVar37._2_2_;
                  auVar35._0_2_ = (ushort)((byte)uVar10 & 1) * auVar37._0_2_;
                  auVar35._4_2_ = (ushort)((byte)(uVar34 >> 2) & 1) * auVar37._4_2_;
                  auVar35._6_2_ = (ushort)((byte)(uVar34 >> 3) & 1) * auVar37._6_2_;
                  auVar35._8_2_ = (ushort)((byte)(uVar34 >> 4) & 1) * auVar37._8_2_;
                  auVar35._10_2_ = (ushort)((byte)(uVar34 >> 5) & 1) * auVar37._10_2_;
                  auVar35._12_2_ = (ushort)((byte)(uVar34 >> 6) & 1) * auVar37._12_2_;
                  auVar35._14_2_ = (ushort)((byte)(uVar34 >> 7) & 1) * auVar37._14_2_;
                  auVar35._16_2_ = (ushort)(bVar12 & 1) * auVar37._16_2_;
                  auVar35._18_2_ = (ushort)(bVar12 >> 1 & 1) * auVar37._18_2_;
                  auVar35._20_2_ = (ushort)(bVar12 >> 2 & 1) * auVar37._20_2_;
                  auVar35._22_2_ = (ushort)(bVar12 >> 3 & 1) * auVar37._22_2_;
                  auVar35._24_2_ = (ushort)(bVar12 >> 4 & 1) * auVar37._24_2_;
                  auVar35._26_2_ = (ushort)(bVar12 >> 5 & 1) * auVar37._26_2_;
                  auVar35._28_2_ = (ushort)(bVar12 >> 6 & 1) * auVar37._28_2_;
                  auVar35._30_2_ = (ushort)(bVar12 >> 7) * auVar37._30_2_;
                  auVar41 = vpmovzxwd_avx512f(auVar35);
                  auVar41 = vpslld_avx512f(auVar41,0x10);
                  auVar41 = vmovdqu32_avx512f(auVar41);
                  *(undefined1 (*) [64])(*pauVar29 + uVar24 * 4) = auVar41;
                  uVar24 = uVar24 + 0x10;
                } while (((ulong)(~uVar31 + uVar20) + 0x10 & 0x1fffffff0) != uVar24);
              }
              lVar23 = lVar23 + 1;
            } while (lVar23 != iVar17);
          }
        }
        else {
          cast_bf16_to_fp32_sse_avx512bf16(bottom_blob,top_blob,opt);
        }
      }
    }
  }
  return iVar15;
}

Assistant:

int Cast_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}